

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::AddAlreadyReserved(RepeatedField<long> *this,long *value)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long *in_RSI;
  int *in_RDI;
  RepeatedField<long> *in_stack_ffffffffffffffe0;
  
  lVar2 = *in_RSI;
  plVar3 = elements(in_stack_ffffffffffffffe0);
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  plVar3[iVar1] = lVar2;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}